

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatDotsTexture *
pbrt::FloatDotsTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  FloatDotsTexture *pFVar1;
  TextureParameterDictionary *in_RCX;
  TextureParameterDictionary *in_RSI;
  TextureMapping2DHandle map;
  FileLoc *in_stack_000003a0;
  Transform *in_stack_000003a8;
  ParameterDictionary *in_stack_000003b0;
  Allocator in_stack_000003b8;
  FloatTextureHandle *args_2;
  string *name;
  TextureParameterDictionary *in_stack_ffffffffffffff50;
  Allocator in_stack_ffffffffffffff58;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined1 local_59 [41];
  TextureParameterDictionary *local_30;
  TextureParameterDictionary *local_18;
  TextureParameterDictionary *local_8;
  
  local_18 = in_RSI;
  local_8 = in_RCX;
  TextureParameterDictionary::operator_cast_to_ParameterDictionary_(in_RSI);
  local_30 = local_8;
  TextureMapping2DHandle::Create
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_000003b8);
  name = (string *)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  TextureParameterDictionary::GetFloatTexture
            (in_stack_ffffffffffffff50,name,(Float)((ulong)local_18 >> 0x20),
             in_stack_ffffffffffffff58);
  args_2 = (FloatTextureHandle *)&stack0xffffffffffffff5f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  TextureParameterDictionary::GetFloatTexture
            (local_8,name,(Float)((ulong)local_18 >> 0x20),in_stack_ffffffffffffff58);
  pFVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::FloatDotsTexture,pbrt::TextureMapping2DHandle&,pbrt::FloatTextureHandle,pbrt::FloatTextureHandle>
                     ((polymorphic_allocator<std::byte> *)local_8,(TextureMapping2DHandle *)name,
                      (FloatTextureHandle *)local_18,args_2);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  return pFVar1;
}

Assistant:

FloatDotsTexture *FloatDotsTexture::Create(const Transform &renderFromTexture,
                                           const TextureParameterDictionary &parameters,
                                           const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    return alloc.new_object<FloatDotsTexture>(
        map, parameters.GetFloatTexture("inside", 1.f, alloc),
        parameters.GetFloatTexture("outside", 0.f, alloc));
}